

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O0

bool __thiscall slang::ast::Type::isByteArray(Type *this)

{
  bool bVar1;
  Type *this_00;
  PredefinedIntegerType *pPVar2;
  Type *elem;
  Type *ct;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  Type *in_stack_ffffffffffffffe0;
  bool local_1;
  
  this_00 = getCanonicalType(in_stack_ffffffffffffffe0);
  bVar1 = isUnpackedArray((Type *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  if (bVar1) {
    if ((this_00->super_Symbol).kind == AssociativeArrayType) {
      local_1 = false;
    }
    else {
      getArrayElementType(this_00);
      getCanonicalType(in_stack_ffffffffffffffe0);
      bVar1 = isPredefinedInteger((Type *)0x73489f);
      local_1 = false;
      if (bVar1) {
        pPVar2 = Symbol::as<slang::ast::PredefinedIntegerType>((Symbol *)0x7348b8);
        local_1 = pPVar2->integerKind == Byte;
      }
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Type::isByteArray() const {
    const Type& ct = getCanonicalType();
    if (!ct.isUnpackedArray())
        return false;

    if (ct.kind == SymbolKind::AssociativeArrayType)
        return false;

    auto& elem = ct.getArrayElementType()->getCanonicalType();
    return elem.isPredefinedInteger() &&
           elem.as<PredefinedIntegerType>().integerKind == PredefinedIntegerType::Byte;
}